

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O3

void __thiscall bdNodeManager::~bdNodeManager(bdNodeManager *this)

{
  pointer pp_Var1;
  pointer puVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  (this->super_bdNode).super_bdNodePublisher._vptr_bdNodePublisher =
       (_func_int **)&PTR_send_ping_001565f8;
  (this->super_BitDhtInterface)._vptr_BitDhtInterface = (_func_int **)&PTR_addBadPeer_001566f0;
  stopDht(this);
  pp_Var1 = (this->mBloomFilter).super_bloomFilter.mHashFns.
            super__Vector_base<unsigned_int_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<unsigned_int_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pp_Var1 != (pointer)0x0) {
    operator_delete(pp_Var1,(long)(this->mBloomFilter).super_bloomFilter.mHashFns.
                                  super__Vector_base<unsigned_int_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<unsigned_int_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pp_Var1
                   );
  }
  puVar2 = (this->mBloomFilter).super_bloomFilter.mBits.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->mBloomFilter).super_bloomFilter.mBits.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  p_Var4 = (this->mCallbacks).super__List_base<BitDhtCallback_*,_std::allocator<BitDhtCallback_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)&this->mCallbacks) {
    p_Var3 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var3;
  }
  std::
  _Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdQueryPeer>,_std::_Select1st<std::pair<const_bdNodeId,_bdQueryPeer>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryPeer>_>_>
  ::~_Rb_tree(&(this->mActivePeers)._M_t);
  bdNode::~bdNode(&this->super_bdNode);
  return;
}

Assistant:

bdNodeManager::~bdNodeManager() {
    stopDht();
}